

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_exact_to_inexact(sexp ctx,sexp self,sexp_sint_t n,sexp i)

{
  sexp psVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp unaff_retaddr;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp res;
  sexp in_stack_ffffffffffffffc0;
  sexp in_stack_ffffffffffffffc8;
  sexp in_stack_ffffffffffffffd0;
  sexp ctx_00;
  undefined8 n_00;
  
  memset(&stack0xffffffffffffffc8,0,0x10);
  if ((in_RCX & 1) == 1) {
    in_RCX = sexp_make_flonum(in_stack_ffffffffffffffc8,(double)in_stack_ffffffffffffffc0);
  }
  else if (((in_RCX & 3) != 0) || (((sexp)in_RCX)->tag != 0xb)) {
    if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0xc)) {
      sexp_bignum_to_double(in_stack_ffffffffffffffd0);
      in_RCX = sexp_make_flonum(in_stack_ffffffffffffffc8,(double)in_RDI);
    }
    else if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0xd)) {
      sexp_ratio_to_double(unaff_retaddr,(sexp)in_RDI);
      in_RCX = sexp_make_flonum(in_stack_ffffffffffffffc8,(double)in_stack_ffffffffffffffc0);
    }
    else if (((in_RCX & 3) == 0) && (((sexp)in_RCX)->tag == 0xe)) {
      ctx_00 = (sexp)(((sexp)in_RDI)->value).context.saves;
      (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffc8;
      n_00 = in_RCX;
      in_RCX = sexp_make_complex(ctx_00,(sexp)&stack0xffffffffffffffd8,in_stack_ffffffffffffffc0);
      psVar1 = sexp_exact_to_inexact((sexp)in_RSI,(sexp)in_RDX,n_00,(sexp)in_RCX);
      (((sexp)in_RCX)->value).type.name = psVar1;
      psVar1 = sexp_exact_to_inexact((sexp)in_RSI,(sexp)in_RDX,n_00,(sexp)in_RCX);
      (((sexp)in_RCX)->value).type.cpl = psVar1;
      (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)ctx_00;
    }
    else {
      in_RCX = sexp_type_exception((sexp)in_RCX,(sexp)in_RCX,(sexp_uint_t)in_stack_ffffffffffffffd0,
                                   in_stack_ffffffffffffffc8);
    }
  }
  return (sexp)in_RCX;
}

Assistant:

sexp sexp_exact_to_inexact (sexp ctx, sexp self, sexp_sint_t n, sexp i) {
  sexp_gc_var1(res);
  res = i;
  if (sexp_fixnump(i))
    res = sexp_fixnum_to_flonum(ctx, i);
#if SEXP_USE_FLONUMS
  else if (sexp_flonump(i))
    res = i;
#endif
#if SEXP_USE_BIGNUMS
  else if (sexp_bignump(i))
    res = sexp_make_flonum(ctx, sexp_bignum_to_double(i));
#endif
#if SEXP_USE_RATIOS
  else if (sexp_ratiop(i))
    res = sexp_make_flonum(ctx, sexp_ratio_to_double(ctx, i));
#endif
#if SEXP_USE_COMPLEX
  else if (sexp_complexp(i)) {
    sexp_gc_preserve1(ctx, res);
    res = sexp_make_complex(ctx, SEXP_ZERO, SEXP_ZERO);
    sexp_complex_real(res) = sexp_exact_to_inexact(ctx, self, 1, sexp_complex_real(i));
    sexp_complex_imag(res) = sexp_exact_to_inexact(ctx, self, 1, sexp_complex_imag(i));
    sexp_gc_release1(ctx);
  }
#endif
  else
    res = sexp_type_exception(ctx, self, SEXP_FIXNUM, i);
  return res;
}